

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O0

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genAnnotations
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema schema)

{
  Reader brand;
  Reader list;
  uint64_t id;
  Schema local_c0;
  Reader local_b8;
  RawBrandedSchema *local_88;
  Reader local_80;
  undefined1 local_50 [8];
  Reader proto;
  CapnpcCapnpMain *this_local;
  Schema schema_local;
  
  proto._reader._40_8_ = this;
  this_local = (CapnpcCapnpMain *)schema.raw;
  schema_local.raw = (RawBrandedSchema *)__return_storage_ptr__;
  Schema::getProto((Reader *)local_50,(Schema *)&this_local);
  capnp::schema::Node::Reader::getAnnotations(&local_80,(Reader *)local_50);
  id = capnp::schema::Node::Reader::getScopeId((Reader *)local_50);
  memset(&local_b8,0,0x30);
  capnp::schema::Brand::Reader::Reader(&local_b8);
  Schema::Schema(&local_c0);
  brand._reader.capTable = local_b8._reader.capTable;
  brand._reader.segment = local_b8._reader.segment;
  brand._reader.data = local_b8._reader.data;
  brand._reader.pointers = local_b8._reader.pointers;
  brand._reader.dataSize = local_b8._reader.dataSize;
  brand._reader.pointerCount = local_b8._reader.pointerCount;
  brand._reader._38_2_ = local_b8._reader._38_2_;
  brand._reader.nestingLimit = local_b8._reader.nestingLimit;
  brand._reader._44_4_ = local_b8._reader._44_4_;
  local_88 = (RawBrandedSchema *)SchemaLoader::get(&this->schemaLoader,id,brand,local_c0);
  list.reader.capTable = local_80.reader.capTable;
  list.reader.segment = local_80.reader.segment;
  list.reader.ptr = local_80.reader.ptr;
  list.reader.elementCount = local_80.reader.elementCount;
  list.reader.step = local_80.reader.step;
  list.reader.structDataSize = local_80.reader.structDataSize;
  list.reader.structPointerCount = local_80.reader.structPointerCount;
  list.reader.elementSize = local_80.reader.elementSize;
  list.reader._39_1_ = local_80.reader._39_1_;
  list.reader.nestingLimit = local_80.reader.nestingLimit;
  list.reader._44_4_ = local_80.reader._44_4_;
  genAnnotations(__return_storage_ptr__,this,list,(Schema)local_88);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree genAnnotations(Schema schema) {
    auto proto = schema.getProto();
    return genAnnotations(proto.getAnnotations(), schemaLoader.get(proto.getScopeId()));
  }